

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O0

Result * validateUpdatableLayerSupport<CoreML::Specification::NeuralNetworkClassifier>
                   (Result *__return_storage_ptr__,NeuralNetworkClassifier *nn)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  LayerCase LVar4;
  string *__rhs;
  undefined1 local_118 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string err;
  Result local_90;
  undefined1 local_61;
  NeuralNetworkLayer *pNStack_60;
  bool isUpdatable;
  NeuralNetworkLayer *layer;
  int local_48;
  byte local_41;
  int i;
  bool isAtleastOneLayerUpdatable;
  Result r;
  NeuralNetworkClassifier *nn_local;
  
  r.m_message.field_2._8_8_ = nn;
  CoreML::Result::Result((Result *)&i);
  local_41 = 0;
  local_48 = 0;
  do {
    iVar1 = local_48;
    iVar3 = CoreML::Specification::NeuralNetworkClassifier::layers_size
                      ((NeuralNetworkClassifier *)r.m_message.field_2._8_8_);
    if (iVar3 <= iVar1) {
      if ((local_41 & 1) == 0) {
        std::__cxx11::string::string((string *)local_118);
        std::__cxx11::string::operator=
                  ((string *)local_118,
                   "The model is marked as updatable, but none of the layers are updatable.");
        CoreML::Result::Result
                  (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_118);
        err.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_118);
      }
      else {
        CoreML::Result::Result(__return_storage_ptr__,(Result *)&i);
        err.field_2._12_4_ = 1;
      }
LAB_009ad461:
      CoreML::Result::~Result((Result *)&i);
      return __return_storage_ptr__;
    }
    pNStack_60 = CoreML::Specification::NeuralNetworkClassifier::layers
                           ((NeuralNetworkClassifier *)r.m_message.field_2._8_8_,local_48);
    local_61 = CoreML::Specification::NeuralNetworkLayer::isupdatable(pNStack_60);
    if ((bool)local_61) {
      local_41 = 1;
      LVar4 = CoreML::Specification::NeuralNetworkLayer::layer_case(pNStack_60);
      if ((LVar4 != kConvolution) && (LVar4 != kInnerProduct)) {
        std::__cxx11::string::string((string *)local_b8);
        __rhs = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_(pNStack_60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&err_1.field_2 + 8),"The layer named \'",__rhs);
        std::operator+(&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&err_1.field_2 + 8),
                       "\' is marked as updatable, however, it is not supported as the type of this layer is neither convolution nor inner-product."
                      );
        std::__cxx11::string::operator=((string *)local_b8,(string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
        CoreML::Result::Result
                  (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_b8);
        err.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_b8);
        goto LAB_009ad461;
      }
      validateWeightParamsUpdatable(&local_90,pNStack_60);
      CoreML::Result::operator=((Result *)&i,&local_90);
      CoreML::Result::~Result(&local_90);
      bVar2 = CoreML::Result::good((Result *)&i);
      if (!bVar2) {
        CoreML::Result::Result(__return_storage_ptr__,(Result *)&i);
        err.field_2._12_4_ = 1;
        goto LAB_009ad461;
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

static Result validateUpdatableLayerSupport(const T& nn) {
    
    Result r;
    bool isAtleastOneLayerUpdatable = false;

    for (int i = 0; i < nn.layers_size(); i++) {
        const Specification::NeuralNetworkLayer& layer = nn.layers(i);
        bool isUpdatable = layer.isupdatable();
        if (isUpdatable) {
            isAtleastOneLayerUpdatable = true;
            switch (layer.layer_case()) {
                case Specification::NeuralNetworkLayer::kConvolution:
                case Specification::NeuralNetworkLayer::kInnerProduct:
                    r = validateWeightParamsUpdatable(layer);
                    if (!r.good()) {return r;}
                    break;
                default:
                    std::string err;
                    err = "The layer named '" + layer.name() + "' is marked as updatable, however, it is not supported as the type of this layer is neither convolution nor inner-product.";
                    return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
            }
        }
    }
    
    if (!isAtleastOneLayerUpdatable) {
        std::string err;
        err = "The model is marked as updatable, but none of the layers are updatable.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    return r;
}